

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  uint x;
  uint y;
  int iVar7;
  uchar *puVar8;
  char *pcVar9;
  byte *pbVar10;
  stbi_uc *psVar11;
  ulong uVar12;
  uchar *puVar13;
  uint uVar14;
  int iVar15;
  int left_1;
  stbi_uc *psVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint unaff_R13D;
  int iVar20;
  uint uVar21;
  long in_FS_OFFSET;
  int left;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_b4;
  stbi_uc local_9c [4];
  ulong local_98;
  stbi_uc *local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  char local_58 [40];
  
  iVar15 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    psVar16 = s->img_buffer;
    if (psVar16 < s->img_buffer_end) {
LAB_00136f6e:
      s->img_buffer = psVar16 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar16 = s->img_buffer;
      goto LAB_00136f6e;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  uVar12 = (ulong)y;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00136faf:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_001371de:
      pcVar9 = "bad file";
      goto LAB_001371ff;
    }
  }
  else {
    iVar15 = (*(s->io).eof)(s->io_user_data);
    if (iVar15 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_00136faf;
      goto LAB_001371de;
    }
  }
  if ((y == 0) || ((x <= (uint)(0x7fffffff / (ulong)y) && (y * x < 0x20000000)))) {
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    puVar8 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    memset(puVar8,0xff,(ulong)(y * x * 4));
    uVar21 = 0;
    bVar6 = 0;
    do {
      if (uVar21 == 10) {
        pcVar9 = "bad format";
LAB_001371a6:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
        bVar3 = false;
      }
      else {
        pbVar10 = s->img_buffer;
        if (pbVar10 < s->img_buffer_end) {
LAB_0013708f:
          s->img_buffer = pbVar10 + 1;
          unaff_R13D = (uint)*pbVar10;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar10 = s->img_buffer;
            goto LAB_0013708f;
          }
          unaff_R13D = 0;
        }
        psVar16 = s->img_buffer;
        if (psVar16 < s->img_buffer_end) {
LAB_001370c8:
          s->img_buffer = psVar16 + 1;
          uVar12 = CONCAT71((int7)(uVar12 >> 8),*psVar16);
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            psVar16 = s->img_buffer;
            goto LAB_001370c8;
          }
          uVar12 = 0;
        }
        lVar2 = (long)(int)uVar21 * 3;
        local_58[lVar2] = (char)uVar12;
        psVar16 = s->img_buffer;
        if (psVar16 < s->img_buffer_end) {
LAB_00137112:
          s->img_buffer = psVar16 + 1;
          sVar4 = *psVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            psVar16 = s->img_buffer;
            goto LAB_00137112;
          }
          sVar4 = '\0';
        }
        local_58[lVar2 + 1] = sVar4;
        pbVar10 = s->img_buffer;
        if (pbVar10 < s->img_buffer_end) {
LAB_0013714c:
          s->img_buffer = pbVar10 + 1;
          bVar5 = *pbVar10;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar10 = s->img_buffer;
            goto LAB_0013714c;
          }
          bVar5 = 0;
        }
        uVar21 = uVar21 + 1;
        local_58[lVar2 + 2] = bVar5;
        bVar6 = bVar6 | bVar5;
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013717e:
          if (s->img_buffer_end <= s->img_buffer) {
LAB_0013719f:
            pcVar9 = "bad file";
            goto LAB_001371a6;
          }
        }
        else {
          iVar15 = (*(s->io).eof)(s->io_user_data);
          if (iVar15 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0013717e;
            goto LAB_0013719f;
          }
        }
        bVar3 = true;
        pcVar9 = "bad format";
        if ((char)uVar12 != '\b') goto LAB_001371a6;
      }
      iVar15 = (int)uVar12;
      if (!bVar3) {
        puVar13 = (uchar *)0x0;
        goto LAB_001375f5;
      }
      if (unaff_R13D == 0) {
        iVar15 = 4 - (uint)((bVar6 & 0x10) == 0);
        if (comp != (int *)0x0) {
          *comp = iVar15;
        }
        puVar13 = puVar8;
        if (y != 0) {
          local_84 = x * 4;
          local_80 = (ulong)y;
          local_78 = (ulong)uVar21;
          local_98 = 0;
          do {
            if (0 < (int)uVar21) {
              local_90 = puVar8 + local_84 * (int)local_98;
              uVar12 = 0;
              do {
                lVar2 = uVar12 * 3;
                cVar1 = local_58[lVar2 + 1];
                local_70 = uVar12;
                if (cVar1 == '\0') {
                  if (x != 0) {
                    bVar6 = local_58[lVar2 + 2];
                    psVar16 = local_90;
                    uVar17 = x;
                    do {
                      psVar11 = stbi__readval(s,(uint)bVar6,psVar16);
                      if (psVar11 == (stbi_uc *)0x0) goto LAB_001375f0;
                      psVar16 = psVar16 + 4;
                      uVar17 = uVar17 - 1;
                    } while (uVar17 != 0);
                  }
                }
                else {
                  psVar16 = local_90;
                  uVar17 = x;
                  if (cVar1 == '\x01') {
                    while (0 < (int)uVar17) {
                      pbVar10 = s->img_buffer;
                      if (pbVar10 < s->img_buffer_end) {
LAB_0013749f:
                        s->img_buffer = pbVar10 + 1;
                        bVar6 = *pbVar10;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar10 = s->img_buffer;
                          goto LAB_0013749f;
                        }
                        bVar6 = 0;
                      }
                      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001374c7:
                        if (s->img_buffer < s->img_buffer_end) goto LAB_001374d7;
LAB_00137537:
                        *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_00137547:
                        bVar3 = false;
                      }
                      else {
                        iVar7 = (*(s->io).eof)(s->io_user_data);
                        if (iVar7 != 0) {
                          if (s->read_from_callbacks != 0) goto LAB_001374c7;
                          goto LAB_00137537;
                        }
LAB_001374d7:
                        psVar11 = stbi__readval(s,(uint)(byte)local_58[lVar2 + 2],local_9c);
                        if (psVar11 == (stbi_uc *)0x0) goto LAB_00137547;
                        if ((int)uVar17 < (int)(uint)bVar6) {
                          bVar6 = (byte)uVar17;
                        }
                        if (bVar6 != 0) {
                          uVar14 = 0;
                          do {
                            bVar5 = local_58[lVar2 + 2];
                            uVar18 = 0x80;
                            lVar19 = 0;
                            do {
                              if ((uVar18 & bVar5) != 0) {
                                psVar16[lVar19] = local_9c[lVar19];
                              }
                              lVar19 = lVar19 + 1;
                              uVar18 = uVar18 >> 1;
                            } while (lVar19 != 4);
                            uVar14 = uVar14 + 1;
                            psVar16 = psVar16 + 4;
                          } while (uVar14 != bVar6);
                        }
                        uVar17 = uVar17 - bVar6;
                        bVar3 = true;
                      }
                      if (!bVar3) goto LAB_001375f0;
                    }
                  }
                  else {
                    local_b4 = x;
                    if (cVar1 != '\x02') {
                      *(char **)(in_FS_OFFSET + -0x10) = "bad format";
LAB_001375f0:
                      puVar13 = (uchar *)0x0;
                      goto LAB_001375f5;
                    }
                    while (0 < (int)local_b4) {
                      pbVar10 = s->img_buffer;
                      if (pbVar10 < s->img_buffer_end) {
LAB_0013731c:
                        s->img_buffer = pbVar10 + 1;
                        bVar6 = *pbVar10;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar10 = s->img_buffer;
                          goto LAB_0013731c;
                        }
                        bVar6 = 0;
                      }
                      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00137343:
                        if (s->img_buffer < s->img_buffer_end) goto LAB_00137353;
LAB_00137393:
                        *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_001373a3:
                        bVar3 = false;
                      }
                      else {
                        iVar7 = (*(s->io).eof)(s->io_user_data);
                        if (iVar7 != 0) {
                          if (s->read_from_callbacks != 0) goto LAB_00137343;
                          goto LAB_00137393;
                        }
LAB_00137353:
                        uVar17 = (uint)bVar6;
                        if ((char)bVar6 < '\0') {
                          if (uVar17 == 0x80) {
                            iVar7 = stbi__get16be(s);
                          }
                          else {
                            iVar7 = uVar17 - 0x7f;
                          }
                          if ((int)local_b4 < iVar7) {
                            *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_00137458:
                            bVar3 = false;
                          }
                          else {
                            psVar11 = stbi__readval(s,(uint)(byte)local_58[lVar2 + 2],local_9c);
                            if (psVar11 == (stbi_uc *)0x0) goto LAB_00137458;
                            bVar3 = true;
                            if (0 < iVar7) {
                              iVar20 = 0;
                              do {
                                bVar6 = local_58[lVar2 + 2];
                                uVar17 = 0x80;
                                lVar19 = 0;
                                do {
                                  if ((uVar17 & bVar6) != 0) {
                                    psVar16[lVar19] = local_9c[lVar19];
                                  }
                                  lVar19 = lVar19 + 1;
                                  uVar17 = uVar17 >> 1;
                                } while (lVar19 != 4);
                                iVar20 = iVar20 + 1;
                                psVar16 = psVar16 + 4;
                              } while (iVar20 != iVar7);
                            }
                          }
                          if (!bVar3) goto LAB_001373a3;
                        }
                        else {
                          if ((int)local_b4 <= (int)uVar17) {
                            *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_001373d6:
                            bVar3 = false;
                            goto LAB_00137468;
                          }
                          iVar7 = uVar17 + 1;
                          iVar20 = uVar17 + 1;
                          do {
                            psVar11 = stbi__readval(s,(uint)(byte)local_58[lVar2 + 2],psVar16);
                            if (psVar11 == (stbi_uc *)0x0) goto LAB_001373d6;
                            psVar16 = psVar16 + 4;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        local_b4 = local_b4 - iVar7;
                        bVar3 = true;
                      }
LAB_00137468:
                      if (!bVar3) goto LAB_001375f0;
                    }
                  }
                }
                uVar12 = local_70 + 1;
              } while (uVar12 != local_78);
            }
            local_98 = local_98 + 1;
          } while (local_98 != local_80);
        }
LAB_001375f5:
        if (puVar13 == (uchar *)0x0) {
          free(puVar8);
          puVar8 = (uchar *)0x0;
        }
        *local_68 = x;
        *local_60 = y;
        if (req_comp != 0) {
          iVar15 = req_comp;
        }
        if (req_comp == 0 && comp != (int *)0x0) {
          iVar15 = *comp;
        }
        puVar8 = stbi__convert_format(puVar8,4,iVar15,x,y);
        return puVar8;
      }
    } while( true );
  }
  pcVar9 = "too large";
LAB_001371ff:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}